

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_struct_tests.cpp
# Opt level: O1

void __thiscall
graph_tests::PathFindingOnMap_ManualBFS_Test::~PathFindingOnMap_ManualBFS_Test
          (PathFindingOnMap_ManualBFS_Test *this)

{
  Test *this_00;
  GTestFlagSaver *pGVar1;
  string *psVar2;
  
  this_00 = (Test *)((long)&this[-1].super_PathFindingOnMap.graph_.nodes_._M_t._M_impl.
                            super__Rb_tree_header._M_header + 0x18);
  *(undefined ***)
   ((long)&this[-1].super_PathFindingOnMap.graph_.nodes_._M_t._M_impl.super__Rb_tree_header.
           _M_header + 0x18) = &PTR__PathFindingOnMap_00177200;
  (this->super_PathFindingOnMap).super_TestWithParam<graph_tests::PathFindingOnMapCase>.super_Test.
  _vptr_Test = (_func_int **)&PTR__PathFindingOnMap_00177240;
  std::
  _Rb_tree<graph_tests::PointOnMap,_graph_tests::PointOnMap,_std::_Identity<graph_tests::PointOnMap>,_std::less<graph_tests::PointOnMap>,_std::allocator<graph_tests::PointOnMap>_>
  ::~_Rb_tree((_Rb_tree<graph_tests::PointOnMap,_graph_tests::PointOnMap,_std::_Identity<graph_tests::PointOnMap>,_std::less<graph_tests::PointOnMap>,_std::allocator<graph_tests::PointOnMap>_>
               *)((long)&(this->super_PathFindingOnMap).graph_.edges_._M_t._M_impl.
                         super__Rb_tree_header._M_header + 0x18));
  std::
  _Rb_tree<graph_tests::PointOnMap,_std::pair<const_graph_tests::PointOnMap,_std::set<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>,_std::less<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>,_std::allocator<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>_>_>,_std::_Select1st<std::pair<const_graph_tests::PointOnMap,_std::set<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>,_std::less<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>,_std::allocator<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>_>_>_>,_std::less<graph_tests::PointOnMap>,_std::allocator<std::pair<const_graph_tests::PointOnMap,_std::set<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>,_std::less<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>,_std::allocator<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<graph_tests::PointOnMap,_std::pair<const_graph_tests::PointOnMap,_std::set<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>,_std::less<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>,_std::allocator<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>_>_>,_std::_Select1st<std::pair<const_graph_tests::PointOnMap,_std::set<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>,_std::less<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>,_std::allocator<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>_>_>_>,_std::less<graph_tests::PointOnMap>,_std::allocator<std::pair<const_graph_tests::PointOnMap,_std::set<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>,_std::less<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>,_std::allocator<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>_>_>_>_>
               *)&(this->super_PathFindingOnMap).answer_.field_2);
  pGVar1 = (this->super_PathFindingOnMap).super_TestWithParam<graph_tests::PathFindingOnMapCase>.
           super_Test.gtest_flag_saver_._M_t.
           super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
           .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl;
  psVar2 = &(this->super_PathFindingOnMap).answer_;
  if (pGVar1 != (GTestFlagSaver *)psVar2) {
    operator_delete(pGVar1,(ulong)((psVar2->_M_dataplus)._M_p + 1));
  }
  testing::Test::~Test(this_00);
  operator_delete(this_00,0x98);
  return;
}

Assistant:

TEST_P(PathFindingOnMap, ManualBFS) {
  const PointOnMap finish = GetFinish();
  std::queue<PointOnMap> q;
  q.push(finish);
  std::set<PointOnMap> visited;
  std::map<PointOnMap, BFSPathPoint> bfs_path;
  while (!q.empty()) {
    const PointOnMap u = q.front();
    q.pop();
    if (visited.find(u) != visited.end())
      continue;
    visited.insert(u);
    for (const PointOnMap& v : graph_.Neighbors(u)) {
      if (visited.find(v) == visited.end()) {
        q.push(v);
        if (u.i < v.i)
          bfs_path.emplace(v, BFSPathPoint(u, 'U'));
        else if (u.i > v.i)
          bfs_path.emplace(v, BFSPathPoint(u, 'D'));
        else if (u.j < v.j)
          bfs_path.emplace(v, BFSPathPoint(u, 'L'));
        else if (u.j > v.j)
          bfs_path.emplace(v, BFSPathPoint(u, 'R'));
      }
    }
  }
  const PointOnMap start = GetStart();
  if (visited.find(start) != visited.end()) {
    PointOnMap u = start;
    do {
      answer_.push_back(bfs_path.find(u)->second.type);
      u = bfs_path.find(u)->second.point;
    } while (u != finish);
  }
}